

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

int TIFFReadRGBATileExt(TIFF *tif,uint32_t col,uint32_t row,uint32_t *raster,int stop_on_error)

{
  uint w;
  int iVar1;
  char *pcVar2;
  char *fmt;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t tile_ysize;
  uint32_t tile_xsize;
  TIFFRGBAImage img;
  char emsg [1024];
  uint local_50c;
  uint local_508;
  int local_504;
  ulong local_500;
  uint local_4f4;
  uint local_4f0;
  uint local_4ec;
  ulong local_4e8;
  size_t local_4e0;
  ulong local_4d8;
  ulong local_4d0;
  TIFFRGBAImage local_4c8;
  char local_438 [1032];
  
  memset(local_438,0,0x400);
  iVar1 = TIFFIsTiled(tif);
  if (iVar1 == 0) {
    pcVar2 = TIFFFileName(tif);
    fmt = "Can\'t use TIFFReadRGBATile() with striped file.";
  }
  else {
    local_500 = (ulong)row;
    TIFFGetFieldDefaulted(tif,0x142,&local_508);
    TIFFGetFieldDefaulted(tif,0x143,&local_50c);
    if ((col % local_508 == 0) && ((int)((local_500 & 0xffffffff) % (ulong)local_50c) == 0)) {
      iVar1 = TIFFRGBAImageOK(tif,local_438);
      if ((iVar1 == 0) ||
         (iVar1 = TIFFRGBAImageBegin(&local_4c8,tif,stop_on_error,local_438), iVar1 == 0)) {
        pcVar2 = TIFFFileName(tif);
        TIFFErrorExtR(tif,pcVar2,"%s",local_438);
        return 0;
      }
      local_4c8.row_offset = (int)local_500;
      uVar5 = local_50c + local_4c8.row_offset;
      local_4f0 = local_4c8.height;
      uVar8 = local_4c8.height - local_4c8.row_offset;
      if (uVar5 <= local_4c8.height) {
        uVar8 = local_50c;
      }
      w = local_4c8.width - col;
      if (local_508 + col <= local_4c8.width) {
        w = local_508;
      }
      uVar4 = (ulong)w;
      local_4c8.col_offset = col;
      iVar1 = TIFFRGBAImageGet(&local_4c8,raster,w,uVar8);
      TIFFRGBAImageEnd(&local_4c8);
      if ((w == local_508) && (uVar8 == local_50c)) {
        return iVar1;
      }
      uVar7 = (ulong)uVar8;
      local_504 = iVar1;
      local_4f4 = uVar5;
      if (uVar8 != 0) {
        local_4e0 = uVar4 * 4;
        local_4e8 = (ulong)uVar8;
        iVar1 = -1;
        uVar3 = 0;
        local_4ec = w;
        local_4d8 = (ulong)uVar8;
        local_4d0 = uVar4;
        do {
          uVar8 = local_508;
          uVar5 = local_50c + iVar1;
          uVar7 = (ulong)local_508;
          memmove(raster + uVar5 * uVar7,raster + (uint)((int)local_4d8 + iVar1) * uVar4,local_4e0);
          _TIFFmemset(raster + uVar5 * uVar7 + uVar4,0,(ulong)(uVar8 - local_4ec) << 2);
          uVar3 = uVar3 + 1;
          iVar1 = iVar1 + -1;
          uVar7 = local_4d8;
        } while (uVar3 < local_4e8);
      }
      iVar1 = local_504;
      if (local_50c <= (uint)uVar7) {
        return local_504;
      }
      uVar8 = local_4f4;
      if (local_4f0 < local_4f4) {
        uVar8 = local_4f0;
      }
      iVar6 = ~uVar8 + (int)local_500;
      do {
        _TIFFmemset(raster + (ulong)(local_50c + iVar6) * (ulong)local_508,0,(ulong)local_508 << 2);
        uVar8 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar8;
        iVar6 = iVar6 + -1;
      } while (uVar8 < local_50c);
      return iVar1;
    }
    pcVar2 = TIFFFileName(tif);
    fmt = "Row/col passed to TIFFReadRGBATile() must be topleft corner of a tile.";
  }
  TIFFErrorExtR(tif,pcVar2,fmt);
  return 0;
}

Assistant:

int TIFFReadRGBATileExt(TIFF *tif, uint32_t col, uint32_t row, uint32_t *raster,
                        int stop_on_error)
{
    char emsg[EMSG_BUF_SIZE] = "";
    TIFFRGBAImage img;
    int ok;
    uint32_t tile_xsize, tile_ysize;
    uint32_t read_xsize, read_ysize;
    uint32_t i_row;

    /*
     * Verify that our request is legal - on a tile file, and on a
     * tile boundary.
     */

    if (!TIFFIsTiled(tif))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Can't use TIFFReadRGBATile() with striped file.");
        return (0);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_TILEWIDTH, &tile_xsize);
    TIFFGetFieldDefaulted(tif, TIFFTAG_TILELENGTH, &tile_ysize);
    if ((col % tile_xsize) != 0 || (row % tile_ysize) != 0)
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Row/col passed to TIFFReadRGBATile() must be top"
                      "left corner of a tile.");
        return (0);
    }

    /*
     * Setup the RGBA reader.
     */

    if (!TIFFRGBAImageOK(tif, emsg) ||
        !TIFFRGBAImageBegin(&img, tif, stop_on_error, emsg))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif), "%s", emsg);
        return (0);
    }

    /*
     * The TIFFRGBAImageGet() function doesn't allow us to get off the
     * edge of the image, even to fill an otherwise valid tile.  So we
     * figure out how much we can read, and fix up the tile buffer to
     * a full tile configuration afterwards.
     */

    if (row + tile_ysize > img.height)
        read_ysize = img.height - row;
    else
        read_ysize = tile_ysize;

    if (col + tile_xsize > img.width)
        read_xsize = img.width - col;
    else
        read_xsize = tile_xsize;

    /*
     * Read the chunk of imagery.
     */

    img.row_offset = row;
    img.col_offset = col;

    ok = TIFFRGBAImageGet(&img, raster, read_xsize, read_ysize);

    TIFFRGBAImageEnd(&img);

    /*
     * If our read was incomplete we will need to fix up the tile by
     * shifting the data around as if a full tile of data is being returned.
     *
     * This is all the more complicated because the image is organized in
     * bottom to top format.
     */

    if (read_xsize == tile_xsize && read_ysize == tile_ysize)
        return (ok);

    for (i_row = 0; i_row < read_ysize; i_row++)
    {
        memmove(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize,
                raster + (size_t)(read_ysize - i_row - 1) * read_xsize,
                read_xsize * sizeof(uint32_t));
        _TIFFmemset(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize +
                        read_xsize,
                    0, sizeof(uint32_t) * (tile_xsize - read_xsize));
    }

    for (i_row = read_ysize; i_row < tile_ysize; i_row++)
    {
        _TIFFmemset(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize, 0,
                    sizeof(uint32_t) * tile_xsize);
    }

    return (ok);
}